

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunner.cpp
# Opt level: O0

TestOutput * __thiscall
CommandLineTestRunner::createJUnitOutput(CommandLineTestRunner *this,SimpleString *packageName)

{
  JUnitTestOutput *this_00;
  JUnitTestOutput *in_RSI;
  JUnitTestOutput *junitOutput;
  SimpleString *in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  this_00 = (JUnitTestOutput *)
            operator_new(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8,0x1702f4);
  JUnitTestOutput::JUnitTestOutput(in_RSI);
  if (this_00 != (JUnitTestOutput *)0x0) {
    JUnitTestOutput::setPackageName(this_00,in_stack_ffffffffffffffc8);
  }
  return &this_00->super_TestOutput;
}

Assistant:

TestOutput* CommandLineTestRunner::createJUnitOutput(const SimpleString& packageName)
{
    JUnitTestOutput* junitOutput = new JUnitTestOutput;
    if (junitOutput != NULLPTR) {
      junitOutput->setPackageName(packageName);
    }
    return junitOutput;
}